

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O1

int Acec_MatchCountCommon(Vec_Wec_t *vLits1,Vec_Wec_t *vLits2,int Shift)

{
  int *piVar1;
  int iVar2;
  Vec_Int_t *p;
  int *piVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  int *piVar9;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar3 = (int *)malloc(400);
  p->pArray = piVar3;
  if (vLits1->nSize < 1) {
    iVar6 = 0;
  }
  else {
    lVar8 = 0;
    iVar6 = 0;
    do {
      lVar4 = lVar8 + Shift;
      if ((-1 < lVar4) && (lVar4 < vLits2->nSize)) {
        piVar3 = vLits1->pArray[lVar8].pArray;
        piVar9 = vLits2->pArray[lVar4].pArray;
        lVar5 = (long)vLits1->pArray[lVar8].nSize;
        iVar2 = vLits2->pArray[lVar4].nSize;
        p->nSize = 0;
        if ((0 < lVar5) && (0 < iVar2)) {
          piVar7 = piVar3 + lVar5;
          piVar1 = piVar9 + iVar2;
          do {
            iVar2 = *piVar3;
            if (iVar2 == *piVar9) {
              Vec_IntPush(p,iVar2);
              piVar3 = piVar3 + 1;
LAB_00660ecd:
              piVar9 = piVar9 + 1;
            }
            else {
              if (iVar2 <= *piVar9) goto LAB_00660ecd;
              piVar3 = piVar3 + 1;
            }
          } while ((piVar3 < piVar7) && (piVar9 < piVar1));
        }
        iVar6 = iVar6 + p->nSize;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vLits1->nSize);
  }
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  return iVar6;
}

Assistant:

int Acec_MatchCountCommon( Vec_Wec_t * vLits1, Vec_Wec_t * vLits2, int Shift )
{
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    Vec_Int_t * vLevel1, * vLevel2; 
    int i, nCommon = 0;
    Vec_WecForEachLevel( vLits1, vLevel1, i )
    {
        if ( i+Shift < 0 || i+Shift >= Vec_WecSize(vLits2) )
            continue;
        vLevel2 = Vec_WecEntry( vLits2, i+Shift );
        nCommon += Vec_IntTwoFindCommonReverse( vLevel1, vLevel2, vRes );
    }
    Vec_IntFree( vRes );
    return nCommon;
}